

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

ListBuilder * __thiscall
capnp::_::PointerBuilder::getListAnySize
          (ListBuilder *__return_storage_ptr__,PointerBuilder *this,word *defaultValue)

{
  anon_union_4_5_35ddcec3_for_WirePointer_1 *paVar1;
  WirePointer *pWVar2;
  CapTableBuilder *capTable;
  word *pwVar3;
  WireValue<uint32_t>_conflict *pWVar4;
  uint uVar5;
  int iVar6;
  WirePointer *pWVar7;
  SegmentBuilder *this_00;
  StructDataBitCount SVar8;
  ushort uVar9;
  ulong uVar10;
  ElementSize EVar11;
  BitsPerElementN<23> BVar12;
  WirePointer *pWVar13;
  Fault f;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  SegmentBuilder *local_40;
  WirePointer *local_38;
  
  local_38 = this->pointer;
  local_40 = this->segment;
  capTable = this->capTable;
  if ((local_38->field_1).upper32Bits == 0 && (local_38->offsetAndKind).value == 0)
  goto LAB_0036802c;
  pWVar7 = local_38 + (long)((int)(local_38->offsetAndKind).value >> 2) + 1;
  while( true ) {
    pWVar13 = local_38;
    this_00 = local_40;
    if (((local_38->offsetAndKind).value & 3) == 2) {
      this_00 = BuilderArena::getSegment
                          ((BuilderArena *)(local_40->super_SegmentReader).arena,
                           (SegmentId)(local_38->field_1).structRef);
      uVar5 = (pWVar13->offsetAndKind).value;
      pwVar3 = (this_00->super_SegmentReader).ptr.ptr;
      uVar10 = (ulong)(uVar5 & 0xfffffff8);
      pWVar2 = (WirePointer *)((long)&pwVar3->content + uVar10);
      pWVar13 = (WirePointer *)((long)&pwVar3[1].content + uVar10);
      if ((uVar5 & 4) == 0) {
        pWVar7 = pWVar13 + ((int)(pWVar2->offsetAndKind).value >> 2);
        pWVar13 = pWVar2;
      }
      else {
        this_00 = BuilderArena::getSegment
                            ((BuilderArena *)(this_00->super_SegmentReader).arena,
                             (SegmentId)(pWVar2->field_1).structRef);
        pWVar7 = (WirePointer *)
                 ((long)&((this_00->super_SegmentReader).ptr.ptr)->content +
                 (ulong)((pWVar2->offsetAndKind).value & 0xfffffff8));
      }
    }
    if (this_00->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_00);
    }
    _kjCondition.left = (pWVar13->offsetAndKind).value & OTHER;
    _kjCondition.right = LIST;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.left == LIST;
    if (_kjCondition.result) {
      EVar11 = (ElementSize)(pWVar13->field_1).upper32Bits & INLINE_COMPOSITE;
      if (EVar11 == INLINE_COMPOSITE) {
        _kjCondition.left = (Kind)*(uint64_t *)&(pWVar7->offsetAndKind).value & OTHER;
        _kjCondition.result = _kjCondition.left == STRUCT;
        _kjCondition.right = STRUCT;
        _kjCondition.op.content.ptr = " == ";
        _kjCondition.op.content.size_ = 5;
        if (!_kjCondition.result) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[62]>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x58c,FAILED,"tag->kind() == WirePointer::STRUCT",
                     "_kjCondition,\"INLINE_COMPOSITE list with non-STRUCT elements not supported.\""
                     ,&_kjCondition,
                     (char (*) [62])"INLINE_COMPOSITE list with non-STRUCT elements not supported.")
          ;
          kj::_::Debug::Fault::fatal(&f);
        }
        paVar1 = &pWVar7->field_1;
        uVar9 = (pWVar7->field_1).structRef.ptrCount.value;
        pWVar4 = &pWVar7->offsetAndKind;
        pWVar7 = pWVar7 + 1;
        BVar12 = ((uint)uVar9 + (uint)*(ushort *)paVar1) * 0x40;
        uVar5 = (uint)*(uint64_t *)&pWVar4->value >> 2 & 0x1fffffff;
        SVar8 = (uint)*(ushort *)paVar1 << 6;
        EVar11 = INLINE_COMPOSITE;
        _kjCondition.left = STRUCT;
      }
      else {
        SVar8 = (&BITS_PER_ELEMENT_TABLE)[EVar11];
        uVar9 = (ushort)(EVar11 == POINTER);
        BVar12 = (uint)(EVar11 == POINTER) * 0x40 + SVar8;
        uVar5 = (pWVar13->field_1).upper32Bits >> 3;
      }
      _kjCondition.op.content.size_ = 5;
      _kjCondition.op.content.ptr = " == ";
      __return_storage_ptr__->segment = this_00;
      __return_storage_ptr__->capTable = capTable;
      __return_storage_ptr__->ptr = (byte *)pWVar7;
      __return_storage_ptr__->elementCount = uVar5;
      __return_storage_ptr__->step = BVar12;
      __return_storage_ptr__->structDataSize = SVar8;
      __return_storage_ptr__->structPointerCount = uVar9;
      __return_storage_ptr__->elementSize = EVar11;
      iVar6 = 1;
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[92]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x582,FAILED,"ref->kind() == WirePointer::LIST",
                 "_kjCondition,\"Schema mismatch: Called getWritableListPointerAnySize() but existing pointer is not a \" \"list.\""
                 ,&_kjCondition,
                 (char (*) [92])
                 "Schema mismatch: Called getWritableListPointerAnySize() but existing pointer is not a list."
                );
      kj::_::Debug::Fault::~Fault(&f);
      iVar6 = 2;
    }
    if (iVar6 != 2) break;
LAB_0036802c:
    if (((WirePointer *)defaultValue == (WirePointer *)0x0) ||
       ((((WirePointer *)defaultValue)->field_1).upper32Bits == 0 &&
        (((WirePointer *)defaultValue)->offsetAndKind).value == 0)) {
      __return_storage_ptr__->ptr = (byte *)0x0;
      __return_storage_ptr__->elementCount = 0;
      __return_storage_ptr__->step = 0;
      __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
      __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
      *(undefined8 *)((long)&__return_storage_ptr__->step + 3) = 0;
      return __return_storage_ptr__;
    }
    pWVar7 = (WirePointer *)
             WireHelpers::copyMessage(&local_40,capTable,&local_38,(WirePointer *)defaultValue);
    defaultValue = (word *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

ListBuilder PointerBuilder::getListAnySize(const word* defaultValue) {
  return WireHelpers::getWritableListPointerAnySize(pointer, segment, capTable, defaultValue);
}